

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v3_purp.cc
# Opt level: O1

int X509_check_akid(X509 *issuer,AUTHORITY_KEYID *akid)

{
  OPENSSL_STACK *sk;
  int iVar1;
  ASN1_INTEGER *x;
  size_t sVar2;
  int *piVar3;
  size_t sVar4;
  X509_NAME *b;
  X509_NAME *a;
  
  if (akid != (AUTHORITY_KEYID *)0x0) {
    if (((akid->keyid != (ASN1_OCTET_STRING *)0x0) &&
        ((ASN1_OCTET_STRING *)issuer->ex_pcpathlen != (ASN1_OCTET_STRING *)0x0)) &&
       (iVar1 = ASN1_OCTET_STRING_cmp(akid->keyid,(ASN1_OCTET_STRING *)issuer->ex_pcpathlen),
       iVar1 != 0)) {
      return 0x1e;
    }
    if (akid->serial != (ASN1_INTEGER *)0x0) {
      x = X509_get_serialNumber(issuer);
      iVar1 = ASN1_INTEGER_cmp(x,akid->serial);
      if (iVar1 != 0) {
        return 0x1f;
      }
    }
    sk = (OPENSSL_STACK *)akid->issuer;
    if (sk != (OPENSSL_STACK *)0x0) {
      sVar2 = OPENSSL_sk_num(sk);
      a = (X509_NAME *)0x0;
      if (sVar2 != 0) {
        sVar2 = 0;
        do {
          piVar3 = (int *)OPENSSL_sk_value(sk,sVar2);
          if (*piVar3 == 4) {
            a = *(X509_NAME **)(piVar3 + 2);
            break;
          }
          sVar2 = sVar2 + 1;
          sVar4 = OPENSSL_sk_num(sk);
        } while (sVar2 < sVar4);
      }
      if (a != (X509_NAME *)0x0) {
        b = X509_get_issuer_name(issuer);
        iVar1 = X509_NAME_cmp(a,b);
        if (iVar1 != 0) {
          return 0x1f;
        }
      }
    }
  }
  return 0;
}

Assistant:

int X509_check_akid(X509 *issuer, const AUTHORITY_KEYID *akid) {
  if (!akid) {
    return X509_V_OK;
  }

  // Check key ids (if present)
  if (akid->keyid && issuer->skid &&
      ASN1_OCTET_STRING_cmp(akid->keyid, issuer->skid)) {
    return X509_V_ERR_AKID_SKID_MISMATCH;
  }
  // Check serial number
  if (akid->serial &&
      ASN1_INTEGER_cmp(X509_get_serialNumber(issuer), akid->serial)) {
    return X509_V_ERR_AKID_ISSUER_SERIAL_MISMATCH;
  }
  // Check issuer name
  if (akid->issuer) {
    // Ugh, for some peculiar reason AKID includes SEQUENCE OF
    // GeneralName. So look for a DirName. There may be more than one but
    // we only take any notice of the first.
    GENERAL_NAMES *gens;
    GENERAL_NAME *gen;
    X509_NAME *nm = NULL;
    size_t i;
    gens = akid->issuer;
    for (i = 0; i < sk_GENERAL_NAME_num(gens); i++) {
      gen = sk_GENERAL_NAME_value(gens, i);
      if (gen->type == GEN_DIRNAME) {
        nm = gen->d.dirn;
        break;
      }
    }
    if (nm && X509_NAME_cmp(nm, X509_get_issuer_name(issuer))) {
      return X509_V_ERR_AKID_ISSUER_SERIAL_MISMATCH;
    }
  }
  return X509_V_OK;
}